

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiApi::error(MidiApi *this,Type type,string *errorString)

{
  pointer pcVar1;
  ostream *poVar2;
  RtMidiError *this_00;
  string errorMessage;
  string local_40;
  
  if (this->errorCallback_ == (RtMidiErrorCallback)0x0) {
    if (type != DEBUG_WARNING) {
      if (type != WARNING) {
        poVar2 = std::operator<<((ostream *)&std::cerr,'\n');
        poVar2 = std::operator<<(poVar2,(string *)errorString);
        std::operator<<(poVar2,"\n\n");
        this_00 = (RtMidiError *)__cxa_allocate_exception(0x30);
        RtMidiError::RtMidiError(this_00,errorString,type);
        __cxa_throw(this_00,&RtMidiError::typeinfo,RtMidiError::~RtMidiError);
      }
      local_40._M_dataplus._M_p._0_1_ = 10;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)&local_40,1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(errorString->_M_dataplus)._M_p,errorString->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\n",2);
    }
  }
  else if (this->firstErrorOccurred_ == false) {
    this->firstErrorOccurred_ = true;
    pcVar1 = (errorString->_M_dataplus)._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + errorString->_M_string_length);
    (*this->errorCallback_)(type,&local_40,this->errorCallbackUserData_);
    this->firstErrorOccurred_ = false;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void MidiApi :: error( RtMidiError::Type type, std::string errorString )
{
  if ( errorCallback_ ) {

    if ( firstErrorOccurred_ )
      return;

    firstErrorOccurred_ = true;
    const std::string errorMessage = errorString;

    errorCallback_( type, errorMessage, errorCallbackUserData_ );
    firstErrorOccurred_ = false;
    return;
  }

  if ( type == RtMidiError::WARNING ) {
    std::cerr << '\n' << errorString << "\n\n";
  }
  else if ( type == RtMidiError::DEBUG_WARNING ) {
#if defined(__RTMIDI_DEBUG__)
    std::cerr << '\n' << errorString << "\n\n";
#endif
  }
  else {
    std::cerr << '\n' << errorString << "\n\n";
    throw RtMidiError( errorString, type );
  }
}